

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_3U>::getSINTPacked
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_3U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  if (c2 + c3 + c1 + c0 != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x431,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  if ((c2 != 0 && (c1 != 0 && c0 != 0)) && c3 != 0) {
    __assert_fail("componentCount == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x433,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x432,
                "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[0])), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[1])), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[2])), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[3])), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }